

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::RPCCall>
reflection::CreateRPCCall
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<reflection::Object> request,Offset<reflection::Object> response,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation)

{
  Offset<reflection::RPCCall> OVar1;
  RPCCallBuilder builder_;
  RPCCallBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  RPCCallBuilder::add_documentation(&local_40,documentation);
  RPCCallBuilder::add_attributes(&local_40,attributes);
  RPCCallBuilder::add_response(&local_40,response);
  RPCCallBuilder::add_request(&local_40,request);
  RPCCallBuilder::add_name(&local_40,name);
  OVar1 = RPCCallBuilder::Finish(&local_40);
  return (Offset<reflection::RPCCall>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<RPCCall> CreateRPCCall(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<reflection::Object> request = 0,
    ::flatbuffers::Offset<reflection::Object> response = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0) {
  RPCCallBuilder builder_(_fbb);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_response(response);
  builder_.add_request(request);
  builder_.add_name(name);
  return builder_.Finish();
}